

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

void * bfy_buffer_make_contiguous(bfy_buffer *buf,size_t wanted)

{
  bfy_pos begin_00;
  bfy_pos begin_01;
  bfy_pos begin_02;
  bfy_pos end;
  bfy_pos end_00;
  bfy_pos end_01;
  int8_t *setme;
  size_t sVar1;
  bfy_buffer *pbVar2;
  bfy_iovec bVar3;
  bfy_pos pos;
  bfy_pos begin;
  bfy_page local_58;
  
  buffer_get_pos(&pos,buf,wanted);
  if ((pos.page_idx != 0) && ((pos.page_idx != 1 || (pos.page_pos != 0)))) {
    buf->changed_muted = buf->changed_muted + 1;
    bVar3 = bfy_buffer_peek_space(buf);
    if (bVar3.iov_len < pos.content_pos) {
      setme = (int8_t *)(*allocator.malloc)(pos.content_pos);
      local_58.data = (int8_t *)0x0;
      local_58.size = 0;
      local_58.read_pos = 0;
      begin_00.content_pos = 0;
      begin_00.page_idx = 0;
      begin_00.page_pos = 0;
      end.page_pos = pos.page_pos;
      end.page_idx = pos.page_idx;
      end.content_pos = pos.content_pos;
      sVar1 = buffer_copyout(buf,begin_00,end,setme);
      begin_01.page_pos = local_58.size;
      begin_01.page_idx = (size_t)local_58.data;
      begin_01.content_pos = local_58.read_pos;
      end_00.page_pos = pos.page_pos;
      end_00.page_idx = pos.page_idx;
      end_00.content_pos = pos.content_pos;
      buffer_drain_range(buf,begin_01,end_00,0);
      local_58.read_pos = 0;
      local_58.flags = 0;
      local_58.unref_cb = (bfy_unref_cb *)0x0;
      local_58.unref_arg = (void *)0x0;
      local_58.data = setme;
      local_58.size = sVar1;
      local_58.write_pos = sVar1;
      buffer_insert_pages(buf,0,&local_58,1);
    }
    else {
      begin_02.content_pos = 0;
      begin_02.page_idx = 0;
      begin_02.page_pos = 0;
      end_01.page_pos = pos.page_pos;
      end_01.page_idx = pos.page_idx;
      end_01.content_pos = pos.content_pos;
      sVar1 = buffer_copyout(buf,begin_02,end_01,bVar3.iov_base);
      bfy_buffer_commit_space(buf,sVar1);
      bfy_buffer_drain(buf,sVar1);
    }
    bfy_buffer_unmute_change_events(buf);
  }
  pbVar2 = (bfy_buffer *)buf->pages;
  if ((bfy_buffer *)buf->pages == (bfy_buffer *)0x0) {
    pbVar2 = buf;
  }
  return (pbVar2->page).data + (pbVar2->page).read_pos;
}

Assistant:

void*
bfy_buffer_make_contiguous(bfy_buffer* buf, size_t wanted) {
    struct bfy_pos const pos = buffer_get_pos(buf, wanted);

    // if the first page already holds wanted, then we're done
    if ((pos.page_idx == 0) || (pos.page_idx == 1 && pos.page_pos == 0)) {
        return buffer_read_begin(buf);
    }

    bfy_buffer_mute_change_events(buf);

    // if we have enough space, use it
    struct bfy_iovec space = bfy_buffer_peek_space(buf);
    if (space.iov_len >= pos.content_pos) {
        size_t const n_copied = buffer_copyout(buf, buffer_get_pos(buf, 0), pos, space.iov_base);
        bfy_buffer_commit_space(buf, n_copied);
        bfy_buffer_drain(buf, n_copied);
    } else {
        // make some new free space, use it, and prepend it
        int8_t* data = allocator.malloc(pos.content_pos);
        size_t const n_moved = buffer_remove(buf, buffer_get_pos(buf, 0), pos, data);
        struct bfy_page const newpage = {
            .data = data,
            .size = n_moved,
            .write_pos = n_moved
        };
        buffer_prepend_pages(buf, &newpage, 1);
    }

    bfy_buffer_unmute_change_events(buf);
    return buffer_read_begin(buf);
}